

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_fdopen.c
# Opt level: O2

zip_t * zip_fdopen(int fd_orig,int _flags,int *zep)

{
  int iVar1;
  FILE *__stream;
  zip_source_t *src;
  zip_t *pzVar2;
  zip_error error;
  
  if ((_flags & 0xffffffebU) == 0) {
    iVar1 = dup(fd_orig);
    if (-1 < iVar1) {
      __stream = fdopen(iVar1,"rb");
      if (__stream != (FILE *)0x0) {
        zip_error_init(&error);
        src = zip_source_filep_create((FILE *)__stream,0,-1,&error);
        if (src == (zip_source_t *)0x0) {
          fclose(__stream);
        }
        else {
          pzVar2 = zip_open_from_source(src,_flags,&error);
          if (pzVar2 != (zip_t *)0x0) {
            zip_error_fini(&error);
            close(fd_orig);
            return pzVar2;
          }
          zip_source_free(src);
        }
        _zip_set_open_error(zep,&error,0);
        zip_error_fini(&error);
        return (zip_t *)0x0;
      }
      close(iVar1);
    }
    iVar1 = 0xb;
  }
  else {
    iVar1 = 0x12;
  }
  _zip_set_open_error(zep,(zip_error_t *)0x0,iVar1);
  return (zip_t *)0x0;
}

Assistant:

ZIP_EXTERN zip_t *
zip_fdopen(int fd_orig, int _flags, int *zep) {
    int fd;
    FILE *fp;
    zip_t *za;
    zip_source_t *src;
    struct zip_error error;

    if (_flags < 0 || (_flags & ~(ZIP_CHECKCONS | ZIP_RDONLY))) {
        _zip_set_open_error(zep, NULL, ZIP_ER_INVAL);
        return NULL;
    }

#ifndef ENABLE_FDOPEN
    _zip_set_open_error(zep, NULL, ZIP_ER_OPNOTSUPP);
    return NULL;
#else
    /* We dup() here to avoid messing with the passed in fd.
       We could not restore it to the original state in case of error. */

    if ((fd = dup(fd_orig)) < 0) {
        _zip_set_open_error(zep, NULL, ZIP_ER_OPEN);
        return NULL;
    }

    if ((fp = fdopen(fd, "rb")) == NULL) {
        close(fd);
        _zip_set_open_error(zep, NULL, ZIP_ER_OPEN);
        return NULL;
    }

    zip_error_init(&error);
    if ((src = zip_source_filep_create(fp, 0, -1, &error)) == NULL) {
        fclose(fp);
        _zip_set_open_error(zep, &error, 0);
        zip_error_fini(&error);
        return NULL;
    }

    if ((za = zip_open_from_source(src, _flags, &error)) == NULL) {
        zip_source_free(src);
        _zip_set_open_error(zep, &error, 0);
        zip_error_fini(&error);
        return NULL;
    }

    zip_error_fini(&error);
    close(fd_orig);
    return za;
#endif
}